

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

bool Data649::loadArchive(char *fname,Issues *issues)

{
  byte bVar1;
  uint uVar2;
  char cVar3;
  bool bVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  vector<int,_std::allocator<int>_> arr;
  string line;
  int a;
  istringstream iss;
  ifstream fin;
  int local_44c;
  int *local_448;
  iterator iStack_440;
  int *local_438;
  undefined1 *local_428;
  undefined8 local_420;
  undefined1 local_418;
  undefined7 uStack_417;
  Draw local_404;
  Issue local_3e8;
  Issues *local_3c0;
  long local_3b8 [4];
  byte abStack_398 [88];
  ios_base local_340 [264];
  long local_238 [4];
  byte abStack_218 [488];
  
  std::vector<Data649::Issue,_std::allocator<Data649::Issue>_>::_M_erase_at_end
            (issues,(issues->super__Vector_base<Data649::Issue,_std::allocator<Data649::Issue>_>).
                    _M_impl.super__Vector_impl_data._M_start);
  std::ifstream::ifstream(local_238,fname,_S_in);
  bVar4 = false;
  if (*(int *)(abStack_218 + *(long *)(local_238[0] + -0x18)) == 0) {
    local_44c = 0;
    local_3c0 = issues;
    do {
      local_428 = &local_418;
      local_420 = 0;
      local_418 = 0;
      cVar3 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_238,(string *)&local_428,cVar3);
      iVar6 = 3;
      if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 2) == 0) {
        local_448 = (int *)0x0;
        iStack_440._M_current = (int *)0x0;
        local_438 = (int *)0x0;
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)local_3b8,(string *)&local_428,_S_in);
        bVar1 = abStack_398[*(long *)(local_3b8[0] + -0x18)];
        while ((bVar1 & 2) == 0) {
          std::istream::operator>>((istream *)local_3b8,&local_3e8.id);
          if (iStack_440._M_current == local_438) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_448,iStack_440,&local_3e8.id);
          }
          else {
            *iStack_440._M_current = local_3e8.id;
            iStack_440._M_current = iStack_440._M_current + 1;
          }
          bVar1 = abStack_398[*(long *)(local_3b8[0] + -0x18)];
        }
        uVar7 = (ulong)((long)iStack_440._M_current - (long)local_448) >> 2;
        iVar6 = (int)uVar7;
        uVar2 = iVar6 - 8U >> 1;
        if (((uVar2 | (uint)((iVar6 - 8U & 1) != 0) << 0x1f) < 10) &&
           ((0x249U >> (uVar2 & 0x1f) & 1) != 0)) {
          local_3e8.draws.super__Vector_base<Data649::Draw,_std::allocator<Data649::Draw>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_3e8.draws.super__Vector_base<Data649::Draw,_std::allocator<Data649::Draw>_>._M_impl.
          super__Vector_impl_data._M_finish = (Draw *)0x0;
          local_3e8.draws.super__Vector_base<Data649::Draw,_std::allocator<Data649::Draw>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (Draw *)0x0;
          local_3e8.id = local_44c;
          local_3e8.year = *local_448;
          local_3e8.idYear = local_448[1];
          if (7 < iVar6) {
            lVar5 = 0x1c;
            uVar7 = 0;
            do {
              local_404.id = (int)uVar7;
              local_404.nums._M_elems[0] = *(int *)((long)local_448 + lVar5 + -0x14);
              local_404.nums._M_elems[1] = *(int *)((long)local_448 + lVar5 + -0x10);
              local_404.nums._M_elems[2] = *(int *)((long)local_448 + lVar5 + -0xc);
              local_404.nums._M_elems[3] = *(int *)((long)local_448 + lVar5 + -8);
              local_404.nums._M_elems[4] = *(int *)((long)local_448 + lVar5 + -4);
              local_404.nums._M_elems[5] = *(int *)((long)local_448 + lVar5);
              if (local_3e8.draws.super__Vector_base<Data649::Draw,_std::allocator<Data649::Draw>_>.
                  _M_impl.super__Vector_impl_data._M_finish ==
                  local_3e8.draws.super__Vector_base<Data649::Draw,_std::allocator<Data649::Draw>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<Data649::Draw,_std::allocator<Data649::Draw>_>::
                _M_realloc_insert<Data649::Draw>
                          (&local_3e8.draws,
                           (iterator)
                           local_3e8.draws.
                           super__Vector_base<Data649::Draw,_std::allocator<Data649::Draw>_>._M_impl
                           .super__Vector_impl_data._M_finish,&local_404);
              }
              else {
                *(ulong *)(((local_3e8.draws.
                             super__Vector_base<Data649::Draw,_std::allocator<Data649::Draw>_>.
                             _M_impl.super__Vector_impl_data._M_finish)->nums)._M_elems + 2) =
                     CONCAT44(local_404.nums._M_elems[3],local_404.nums._M_elems[2]);
                *(ulong *)(((local_3e8.draws.
                             super__Vector_base<Data649::Draw,_std::allocator<Data649::Draw>_>.
                             _M_impl.super__Vector_impl_data._M_finish)->nums)._M_elems + 4) =
                     CONCAT44(local_404.nums._M_elems[5],local_404.nums._M_elems[4]);
                (local_3e8.draws.super__Vector_base<Data649::Draw,_std::allocator<Data649::Draw>_>.
                 _M_impl.super__Vector_impl_data._M_finish)->id = local_404.id;
                ((local_3e8.draws.super__Vector_base<Data649::Draw,_std::allocator<Data649::Draw>_>.
                  _M_impl.super__Vector_impl_data._M_finish)->nums)._M_elems[0] =
                     local_404.nums._M_elems[0];
                *(ulong *)(((local_3e8.draws.
                             super__Vector_base<Data649::Draw,_std::allocator<Data649::Draw>_>.
                             _M_impl.super__Vector_impl_data._M_finish)->nums)._M_elems + 1) =
                     CONCAT44(local_404.nums._M_elems[2],local_404.nums._M_elems[1]);
                local_3e8.draws.super__Vector_base<Data649::Draw,_std::allocator<Data649::Draw>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     local_3e8.draws.
                     super__Vector_base<Data649::Draw,_std::allocator<Data649::Draw>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              uVar7 = uVar7 + 1;
              lVar5 = lVar5 + 0x18;
            } while ((ulong)(iVar6 - 2) / 6 != uVar7);
          }
          std::vector<Data649::Issue,_std::allocator<Data649::Issue>_>::emplace_back<Data649::Issue>
                    (local_3c0,&local_3e8);
          if (local_3e8.draws.super__Vector_base<Data649::Draw,_std::allocator<Data649::Draw>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_3e8.draws.
                            super__Vector_base<Data649::Draw,_std::allocator<Data649::Draw>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_3e8.draws.
                                  super__Vector_base<Data649::Draw,_std::allocator<Data649::Draw>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_3e8.draws.
                                  super__Vector_base<Data649::Draw,_std::allocator<Data649::Draw>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          local_44c = local_44c + 1;
          iVar6 = 0;
        }
        else {
          fprintf(_stderr,"Unexpected number of integers in archive line: %d\n",uVar7 & 0xffffffff);
          iVar6 = 1;
        }
        std::__cxx11::istringstream::~istringstream((istringstream *)local_3b8);
        std::ios_base::~ios_base(local_340);
        if (local_448 != (int *)0x0) {
          operator_delete(local_448,(long)local_438 - (long)local_448);
        }
      }
      if (local_428 != &local_418) {
        operator_delete(local_428,CONCAT71(uStack_417,local_418) + 1);
      }
    } while (iVar6 == 0);
    if (iVar6 == 3) {
      bVar4 = true;
      std::ifstream::close();
    }
    else {
      bVar4 = false;
    }
  }
  std::ifstream::~ifstream(local_238);
  return bVar4;
}

Assistant:

bool loadArchive(const char * fname, Issues & issues) {
    issues.clear();

    std::ifstream fin(fname);
    if (!fin.good()) return false;

    int curIssueId = 0;

    while (true) {
        std::string line;
        std::getline(fin, line);
        if (fin.eof()) break;

        std::vector<int> arr;
        std::istringstream iss(line);
        while (true) {
            int a;
            if (iss.eof()) break;
            iss >> a;
            arr.push_back(a);
        }

        int n = arr.size();
        if (n != 8 && n != 14 && n != 20 && n != 26) {
            fprintf(stderr, "Unexpected number of integers in archive line: %d\n", n);
            return false;
        }

        Issue issue;
        issue.id = curIssueId;
        issue.year = arr[0];
        issue.idYear = arr[1];

        int ndraws = (n - 2)/6;
        for (int i = 0; i < ndraws; ++i) {
            Draw draw;
            draw.id = i;
            draw.nums[0] = arr[2 + i*6 + 0];
            draw.nums[1] = arr[2 + i*6 + 1];
            draw.nums[2] = arr[2 + i*6 + 2];
            draw.nums[3] = arr[2 + i*6 + 3];
            draw.nums[4] = arr[2 + i*6 + 4];
            draw.nums[5] = arr[2 + i*6 + 5];

            issue.draws.emplace_back(std::move(draw));
        }

        issues.emplace_back(std::move(issue));

        ++curIssueId;
    }

    fin.close();

    return true;
}